

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsoncpp_json_serializer.cpp
# Opt level: O0

bool __thiscall dap::json::JsonCppDeserializer::deserialize(JsonCppDeserializer *this,object *v)

{
  undefined8 this_00;
  bool bVar1;
  ArrayIndex AVar2;
  reference json;
  mapped_type *this_01;
  const_iterator cVar3;
  String local_e0;
  uint local_c0;
  undefined1 local_b0 [8];
  any val;
  JsonCppDeserializer d;
  SelfType local_50;
  _Base_ptr local_40;
  undefined1 local_38;
  undefined1 local_30 [8];
  const_iterator i;
  object *v_local;
  JsonCppDeserializer *this_local;
  
  i.super_ValueIteratorBase._8_8_ = v;
  AVar2 = Json::Value::size(this->json);
  std::
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dap::any,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dap::any>_>_>
  ::reserve(v,(ulong)AVar2);
  cVar3 = Json::Value::begin(this->json);
  local_40 = (_Base_ptr)cVar3.super_ValueIteratorBase.current_._M_node;
  local_38 = cVar3.super_ValueIteratorBase.isNull_;
  local_30 = (undefined1  [8])local_40;
  i.super_ValueIteratorBase.current_._M_node._0_1_ = local_38;
  while( true ) {
    cVar3 = Json::Value::end(this->json);
    local_50.current_ = cVar3.super_ValueIteratorBase.current_._M_node;
    local_50.isNull_ = cVar3.super_ValueIteratorBase.isNull_;
    bVar1 = Json::ValueIteratorBase::operator!=((ValueIteratorBase *)local_30,&local_50);
    if (!bVar1) break;
    json = Json::ValueConstIterator::operator*((ValueConstIterator *)local_30);
    JsonCppDeserializer((JsonCppDeserializer *)(val.buffer + 0x18),json);
    any::any((any *)local_b0);
    bVar1 = deserialize((JsonCppDeserializer *)(val.buffer + 0x18),(any *)local_b0);
    this_00 = i.super_ValueIteratorBase._8_8_;
    if (bVar1) {
      Json::ValueIteratorBase::name_abi_cxx11_(&local_e0,(ValueIteratorBase *)local_30);
      this_01 = std::
                unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dap::any,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dap::any>_>_>
                ::operator[]((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dap::any,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dap::any>_>_>
                              *)this_00,&local_e0);
      any::operator=(this_01,(any *)local_b0);
      std::__cxx11::string::~string((string *)&local_e0);
    }
    else {
      this_local._7_1_ = 0;
    }
    local_c0 = (uint)!bVar1;
    any::~any((any *)local_b0);
    ~JsonCppDeserializer((JsonCppDeserializer *)(val.buffer + 0x18));
    if (local_c0 != 0) goto LAB_0100066e;
    Json::ValueConstIterator::operator++((ValueConstIterator *)local_30,0);
  }
  this_local._7_1_ = 1;
LAB_0100066e:
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool JsonCppDeserializer::deserialize(dap::object* v) const {
  v->reserve(json->size());
  for (auto i = json->begin(); i != json->end(); i++) {
    JsonCppDeserializer d(&*i);
    dap::any val;
    if (!d.deserialize(&val)) {
      return false;
    }
    (*v)[i.name()] = val;
  }
  return true;
}